

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_stream.hpp
# Opt level: O1

string * __thiscall
iutest::detail::IInStream::ReadAll_abi_cxx11_(string *__return_storage_ptr__,IInStream *this)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  char *__s;
  long lVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar2 = (*this->_vptr_IInStream[3])(this);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (lVar3 != 0) {
    __s = (char *)operator_new__(lVar3 + 1);
    __s[lVar3] = '\0';
    iVar2 = (*this->_vptr_IInStream[2])(this,__s,lVar3,1);
    if ((char)iVar2 != '\0') {
      pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)__s);
    }
    operator_delete__(__s);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual ::std::string ReadAll()
    {
        ::std::string str;
        const size_t size = static_cast<size_t>(GetSize());
        if( size != 0 )
        {
            char* buf = new char[size+1];
            buf[size] = '\0';
            if( Read(buf, size, 1) )
            {
                str = buf;
            }
            delete [] buf;
        }
        return str;
    }